

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_ep_fini(void *arg)

{
  undefined4 local_1c;
  int i;
  udp_ep *ep;
  void *arg_local;
  
  nni_aio_fini((nni_aio *)((long)arg + 0x58));
  nni_aio_fini((nni_aio *)((long)arg + 0x220));
  nni_aio_fini((nni_aio *)((long)arg + 0x490));
  nni_aio_fini((nni_aio *)((long)arg + 0x658));
  if (*arg != 0) {
    nni_plat_udp_close(*arg);
  }
  for (local_1c = 0; local_1c < (int)(uint)*(ushort *)((long)arg + 0xa46); local_1c = local_1c + 1)
  {
    nni_msg_free(*(nni_msg **)(*(long *)((long)arg + 0xa38) + (long)local_1c * 0xb0 + 0x18));
    *(undefined8 *)(*(long *)((long)arg + 0xa38) + (long)local_1c * 0xb0 + 0x18) = 0;
  }
  nni_msg_free(*(nni_msg **)((long)arg + 0x400));
  nni_id_map_fini((nni_id_map *)((long)arg + 0x820));
  nni_free(*(void **)((long)arg + 0xa38),(ulong)*(ushort *)((long)arg + 0xa46) * 0xb0);
  return;
}

Assistant:

static void
udp_ep_fini(void *arg)
{
	udp_ep *ep = arg;

	nni_aio_fini(&ep->timeaio);
	nni_aio_fini(&ep->resaio);
	nni_aio_fini(&ep->tx_aio);
	nni_aio_fini(&ep->rx_aio);

	if (ep->udp != NULL) {
		nni_udp_close(ep->udp);
	}

	for (int i = 0; i < ep->tx_ring.size; i++) {
		nni_msg_free(ep->tx_ring.descs[i].payload);
		ep->tx_ring.descs[i].payload = NULL;
	}
	nni_msg_free(ep->rx_payload); // safe even if msg is null
	nni_id_map_fini(&ep->pipes);
	NNI_FREE_STRUCTS(ep->tx_ring.descs, ep->tx_ring.size);
}